

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_lock.hpp
# Opt level: O3

void __thiscall unodb::optimistic_lock::dump(optimistic_lock *this,ostream *os)

{
  __atomic_base<unsigned_long> local_28;
  version_type dump_version;
  
  local_28._M_i = (this->version).version.super___atomic_base<unsigned_long>._M_i;
  std::__ostream_insert<char,std::char_traits<char>>(os,"lock: ",6);
  version_type::dump((version_type *)&local_28,os);
  std::__ostream_insert<char,std::char_traits<char>>(os," current read lock count = ",0x1b);
  std::ostream::_M_insert<long>((long)os);
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream &os) const {
    const auto dump_version = version.load_acquire();
    os << "lock: ";
    dump_version.dump(os);
#ifndef NDEBUG
    os << " current read lock count = "
       << read_lock_count.load(std::memory_order_acquire);
#endif
  }